

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O0

void Dar_LibBuildClear_rec(Dar_LibObj_t *pObj,int *pCounter)

{
  uint uVar1;
  Dar_LibObj_t *pDVar2;
  int *pCounter_local;
  Dar_LibObj_t *pObj_local;
  
  if (((ulong)*pObj >> 0x23 & 1) == 0) {
    uVar1 = *pCounter;
    *pCounter = uVar1 + 1;
    *pObj = (Dar_LibObj_t)((ulong)*pObj & 0xfffffffff | (ulong)uVar1 << 0x24);
    s_DarLib->pDatas[(ulong)*pObj >> 0x24].field_0.pFunc = (Aig_Obj_t *)0x0;
    pDVar2 = Dar_LibObj(s_DarLib,SUB84(*pObj,0) & 0xffff);
    Dar_LibBuildClear_rec(pDVar2,pCounter);
    pDVar2 = Dar_LibObj(s_DarLib,SUB84(*pObj,2) & 0xffff);
    Dar_LibBuildClear_rec(pDVar2,pCounter);
  }
  return;
}

Assistant:

void Dar_LibBuildClear_rec( Dar_LibObj_t * pObj, int * pCounter )
{
    if ( pObj->fTerm )
        return;
    pObj->Num = (*pCounter)++;
    s_DarLib->pDatas[ pObj->Num ].pFunc = NULL;
    Dar_LibBuildClear_rec( Dar_LibObj(s_DarLib, pObj->Fan0), pCounter );
    Dar_LibBuildClear_rec( Dar_LibObj(s_DarLib, pObj->Fan1), pCounter );
}